

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void nlohmann::detail::
     from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *j,string_t *s)

{
  type_error *__return_storage_ptr__;
  char *__s;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (j->m_type == string) {
    std::__cxx11::string::_M_assign((string *)s);
    return;
  }
  __return_storage_ptr__ = (type_error *)__cxa_allocate_exception(0x20);
  __s = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::type_name(j);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,__s,&local_59);
  std::operator+(&local_38,"type must be string, but is ",&local_58);
  type_error::create(__return_storage_ptr__,0x12e,&local_38);
  __cxa_throw(__return_storage_ptr__,&type_error::typeinfo,exception::~exception);
}

Assistant:

void from_json(const BasicJsonType& j, typename BasicJsonType::string_t& s)
{
if (JSON_HEDLEY_UNLIKELY(!j.is_string()))
{
JSON_THROW(type_error::create(302, "type must be string, but is " + std::string(j.type_name())));
}
s = *j.template get_ptr<const typename BasicJsonType::string_t*>();
}